

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTransform.h
# Opt level: O0

void __thiscall
xmrig::BaseTransform::set<bool>(BaseTransform *this,Document *doc,char *objKey,char *key,bool value)

{
  byte bVar1;
  bool bVar2;
  BaseTransform *in_RCX;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RSI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  byte in_R8B;
  undefined4 unaff_retaddr;
  Type unaff_retaddr_00;
  StringRefType *in_stack_00000008;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_00000010;
  char *in_stack_ffffffffffffffa8;
  Ch *in_stack_ffffffffffffffb8;
  undefined1 value_00;
  char *in_stack_ffffffffffffffc8;
  Value *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  
  bVar1 = in_R8B & 1;
  allocator = in_RDI;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)in_RDI,in_stack_ffffffffffffffb8);
  value_00 = (undefined1)((ulong)in_RDI >> 0x38);
  if (!bVar2) {
    rapidjson::StringRef<char>(in_stack_ffffffffffffffa8);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GetAllocator(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<rapidjson::Type>(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,allocator);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  operator[]<char_const>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)allocator);
  set<bool>(in_RCX,(Document *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
            in_stack_ffffffffffffffc8,(bool)value_00);
  return;
}

Assistant:

inline void set(rapidjson::Document &doc, const char *objKey, const char *key, T value)
    {
        if (!doc.HasMember(objKey)) {
            doc.AddMember(rapidjson::StringRef(objKey), rapidjson::kObjectType, doc.GetAllocator());
        }

        set<T>(doc, doc[objKey], key, value);
    }